

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O2

void __thiscall jsonip::writer<true>::array_start(writer<true> *this)

{
  ostream *poVar1;
  string local_40;
  
  pre(this);
  std::operator<<(this->os,'[');
  this->level = this->level + 1;
  poVar1 = std::operator<<(this->os,'\n');
  indent_abi_cxx11_(&local_40,this);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this->comma = false;
  return;
}

Assistant:

void array_start()
        {
            pre();
            os << '[';
            ++level;
            if (indent_)
            {
                os << '\n' << indent();
            }
            comma = false;
        }